

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::BasicResult
          (BasicResult<Catch::clara::detail::ParseState> *this,Type type,string *message)

{
  string *in_RDX;
  ResultValueBase<Catch::clara::detail::ParseState> *in_RDI;
  Type in_stack_ffffffffffffffcc;
  
  ResultValueBase<Catch::clara::detail::ParseState>::ResultValueBase
            (in_RDI,in_stack_ffffffffffffffcc);
  (in_RDI->super_ResultBase)._vptr_ResultBase = (_func_int **)&PTR__BasicResult_004904a0;
  ::std::__cxx11::string::string((string *)(in_RDI + 1),in_RDX);
  return;
}

Assistant:

BasicResult( ResultBase::Type type, std::string const &message )
        :   ResultValueBase<T>(type),
            m_errorMessage(message)
        {
            assert( m_type != ResultBase::Ok );
        }